

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O2

bool woff2::anon_unknown_4::WriteNormalizedLoca(int index_fmt,int num_glyphs,Font *font)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  uint8_t *dst;
  int iVar1;
  bool bVar2;
  int glyph_index;
  Table *pTVar3;
  Table *pTVar4;
  ulong uVar5;
  pointer puVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  ulong __new_size;
  uint uVar10;
  bool bVar11;
  size_t loca_offset;
  size_t glyph_size;
  uint8_t *glyph_data;
  Glyph glyph;
  pointer local_a8;
  ulong local_a0;
  size_t local_98;
  ulong local_90;
  Font *local_88;
  size_t local_80;
  uint8_t *local_78;
  Glyph local_70;
  
  pTVar3 = Font::FindTable(font,0x676c7966);
  local_88 = font;
  pTVar4 = Font::FindTable(font,0x6c6f6361);
  this = &pTVar4->buffer;
  uVar8 = num_glyphs + 1;
  uVar10 = (num_glyphs & 0xfffffffcU) + 4;
  if (0xfffffffc < (uVar8 | 0x80000000)) {
    uVar10 = uVar8;
  }
  bVar7 = 2 - (index_fmt == 0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this,(long)(int)(uVar10 << (bVar7 & 0x1f)));
  pTVar4->length = uVar8 << (bVar7 & 0x1f);
  uVar10 = 0;
  if (num_glyphs == 0) {
    local_a8 = (pointer)0x0;
  }
  else {
    local_a8 = (pTVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
  }
  dst = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start;
  local_98 = 0;
  iVar9 = 0;
  if (0 < num_glyphs) {
    iVar9 = num_glyphs;
  }
  iVar1 = 0;
  local_90 = (ulong)(uint)num_glyphs;
  do {
    glyph_index = iVar1;
    StoreLoca(index_fmt,uVar10,&local_98,dst);
    __new_size = (ulong)uVar10;
    if (iVar9 == glyph_index) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pTVar3->buffer,__new_size)
      ;
      if (uVar10 == 0) {
        puVar6 = (pointer)0x0;
      }
      else {
        puVar6 = (pTVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      }
      pTVar3->data = puVar6;
      pTVar3->length = uVar10;
      if (local_98 == 0) {
        puVar6 = (pointer)0x0;
      }
      else {
        puVar6 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      pTVar4->data = puVar6;
      break;
    }
    local_70.instructions_size = 0;
    local_70.contours.
    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.contours.
    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.contours.
    super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.composite_data_size = 0;
    bVar2 = GetGlyphData(local_88,glyph_index,&local_78,&local_80);
    if ((bVar2) && ((local_80 == 0 || (bVar2 = ReadGlyph(local_78,local_80,&local_70), bVar2)))) {
      local_a0 = (long)(pTVar3->buffer).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)((pTVar3->buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + __new_size);
      bVar2 = StoreGlyph(&local_70,local_a8 + __new_size,&local_a0);
      if (!bVar2) goto LAB_0010d201;
      uVar5 = local_a0 + 3 & 0xfffffffffffffffc;
      if (0xfffffffffffffffc < local_a0) {
        uVar5 = local_a0;
      }
      if ((uVar5 >> 0x20 != 0) || (CARRY4(uVar10,(uint)uVar5))) goto LAB_0010d201;
      bVar11 = uVar5 + __new_size < 0x20000;
      bVar2 = bVar11 || index_fmt != 0;
      uVar8 = 0;
      if (bVar11 || index_fmt != 0) {
        uVar8 = (uint)uVar5;
      }
      uVar10 = uVar10 + uVar8;
    }
    else {
LAB_0010d201:
      bVar2 = false;
    }
    std::
    vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
    ::~vector(&local_70.contours);
    iVar1 = glyph_index + 1;
  } while (bVar2);
  return (int)local_90 <= glyph_index;
}

Assistant:

bool WriteNormalizedLoca(int index_fmt, int num_glyphs, Font* font) {
  Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  Font::Table* loca_table = font->FindTable(kLocaTableTag);

  int glyph_sz = index_fmt == 0 ? 2 : 4;
  loca_table->buffer.resize(Round4(num_glyphs + 1) * glyph_sz);
  loca_table->length = (num_glyphs + 1) * glyph_sz;

  uint8_t* glyf_dst = num_glyphs ? &glyf_table->buffer[0] : NULL;
  uint8_t* loca_dst = &loca_table->buffer[0];
  uint32_t glyf_offset = 0;
  size_t loca_offset = 0;

  for (int i = 0; i < num_glyphs; ++i) {
    StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    size_t glyf_dst_size = glyf_table->buffer.size() - glyf_offset;
    if (!StoreGlyph(glyph, glyf_dst + glyf_offset, &glyf_dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_dst_size = Round4(glyf_dst_size);
    if (glyf_dst_size > std::numeric_limits<uint32_t>::max() ||
        glyf_offset + static_cast<uint32_t>(glyf_dst_size) < glyf_offset ||
        (index_fmt == 0 && glyf_offset + glyf_dst_size >= (1UL << 17))) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyf_offset += glyf_dst_size;
  }

  StoreLoca(index_fmt, glyf_offset, &loca_offset, loca_dst);

  glyf_table->buffer.resize(glyf_offset);
  glyf_table->data = glyf_offset ? &glyf_table->buffer[0] : NULL;
  glyf_table->length = glyf_offset;
  loca_table->data = loca_offset ? &loca_table->buffer[0] : NULL;

  return true;
}